

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Env::set(V2Env *this,syVEnv *para)

{
  float fVar1;
  
  fVar1 = exp2f(para->ar * -0.09375 + 7.0);
  this->atd = fVar1;
  fVar1 = exp2f(((1.0 - para->dr * 0.0078125) + -1.0) * 11.0);
  this->dcf = 1.0 - fVar1;
  this->sul = para->sl;
  fVar1 = exp2f((para->sr + -64.0) * 0.0019375);
  this->suf = fVar1;
  fVar1 = exp2f(((1.0 - para->rr * 0.0078125) + -1.0) * 11.0);
  this->ref = 1.0 - fVar1;
  this->gain = para->vol * 0.0078125;
  return;
}

Assistant:

void set(const syVEnv *para)
    {
        // ar: 2^7 (128) to 2^-4 (0.03, ca. 10 secs at 344frames/sec)
        atd = powf(2.0f, para->ar * fcattackmul + fcattackadd);

        // dcf: 0 (5msecs thanks to volramping) up to almost 1
        dcf = 1.0f - calcfreq2(1.0f - para->dr / 128.0f);

        // sul: 0..127 is fine already
        sul = para->sl;

        // suf: 1/128 (15ms till it's gone) up to 128 (15ms till it's fully there)
        suf = powf(2.0f, fcsusmul * (para->sr - 64.0f));

        // ref: 0 (5ms thanks to volramping) up to almost 1
        ref = 1.0f - calcfreq2(1.0f - para->rr / 128.0f);
        gain = para->vol / 128.0f;
    }